

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O0

void __thiscall
QueryTests_SelectDataSetWithCriteria_canDetermineSpecificationForSelectDataSetWithCriteria_Test::
TestBody(QueryTests_SelectDataSetWithCriteria_canDetermineSpecificationForSelectDataSetWithCriteria_Test
         *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar1;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  *paVar2;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  *this_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_06;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  bool bVar3;
  TransactionMetaType TVar4;
  TransactionType TVar5;
  char *pcVar6;
  char *in_R9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_11d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1160;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_1078;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_1060;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_1048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fe0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_f40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_f28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ed0;
  string local_e88;
  AssertHelper local_e68;
  Message local_e60;
  api_filter_type local_e58;
  bool local_e21;
  undefined1 local_e20 [8];
  AssertionResult gtest_ar__16;
  ComparisonType local_e08 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_e00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_df8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_dd0;
  iterator local_da8;
  size_type local_da0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_d98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_d80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_d78;
  iterator local_d40;
  size_type local_d38;
  undefined1 local_d30 [8];
  api_filter_type filter3;
  AssertHelper local_ce0;
  Message local_cd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cd0;
  bool local_cb1;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar__15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  string local_c70 [32];
  string local_c50 [32];
  iterator local_c30;
  size_type local_c28;
  undefined1 local_c20 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_dataset3;
  AssertHelper local_be8;
  Message local_be0;
  string local_bd8;
  bool local_bb1;
  undefined1 local_bb0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_b80;
  Message local_b78;
  string local_b70;
  bool local_b49;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_b18;
  Message local_b10;
  bool local_b01;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_ad0;
  Message local_ac8;
  bool local_ab9;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar__11;
  Query query_select_dataset_with_criteria3;
  AssertHelper local_978;
  Message local_970;
  api_filter_type local_968;
  bool local_931;
  undefined1 local_930 [8];
  AssertionResult gtest_ar__10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_910;
  iterator local_8e8;
  size_type local_8e0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_8d8;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  local_8bd;
  ComparisonType local_8bc;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_8b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_8b0;
  iterator local_888;
  size_type local_880;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_878;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_860;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_858;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_820;
  iterator local_7e8;
  size_type local_7e0;
  undefined1 local_7d8 [8];
  api_filter_type filter2;
  AssertHelper local_788;
  Message local_780;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_778;
  bool local_759;
  undefined1 local_758 [8];
  AssertionResult gtest_ar__9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  iterator local_718;
  size_type local_710;
  undefined1 local_708 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_dataset2;
  AssertHelper local_6d0;
  Message local_6c8;
  string local_6c0;
  bool local_699;
  undefined1 local_698 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_668;
  Message local_660;
  string local_658;
  bool local_631;
  undefined1 local_630 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_600;
  Message local_5f8;
  bool local_5e9;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_5b8;
  Message local_5b0;
  bool local_5a1;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar__5;
  Query query_select_dataset_with_criteria2;
  AssertHelper local_460;
  Message local_458;
  api_filter_type local_450;
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_3f8;
  iterator local_3d0;
  size_type local_3c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_3c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_3a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_3a0;
  iterator local_368;
  size_type local_360;
  undefined1 local_358 [8];
  api_filter_type filter1;
  AssertHelper local_308;
  Message local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298 [32];
  iterator local_278;
  size_type local_270;
  undefined1 local_268 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_dataset1;
  AssertHelper local_230;
  Message local_228;
  string local_220;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1c8;
  Message local_1c0;
  string local_1b8;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__1;
  string local_178;
  AssertHelper local_158;
  Message local_150 [3];
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  Query query_select_dataset_with_criteria1;
  QueryTests_SelectDataSetWithCriteria_canDetermineSpecificationForSelectDataSetWithCriteria_Test
  *this_local;
  
  database::Query::Query
            ((Query *)&gtest_ar_.message_,
             "select employee_id,employee_name from company.employee where employee_id = 1");
  TVar4 = database::Query::transactionMetaType((Query *)&gtest_ar_.message_);
  local_131 = TVar4 == dml;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar3) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)local_130,
               (AssertionResult *)
               "query_select_dataset_with_criteria1.transactionMetaType() == database::dml","false",
               "true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0x86,pcVar6);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    testing::Message::~Message(local_150);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    database::Query::databaseName_abi_cxx11_(&local_1b8,(Query *)&gtest_ar_.message_);
    local_191 = std::operator==(&local_1b8,"company");
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_190,&local_191,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_1b8);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar3) {
      testing::Message::Message(&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_190,
                 (AssertionResult *)
                 "query_select_dataset_with_criteria1.databaseName() == \"company\"","false","true",
                 in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0x87,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_1c0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      database::Query::containerName_abi_cxx11_(&local_220,(Query *)&gtest_ar_.message_);
      local_1f9 = std::operator==(&local_220,"employee");
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_220);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
      if (!bVar3) {
        testing::Message::Message(&local_228);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &expected_dataset1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1f8,
                   (AssertionResult *)
                   "query_select_dataset_with_criteria1.containerName() == \"employee\"","false",
                   "true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                   ,0x88,pcVar6);
        testing::internal::AssertHelper::operator=(&local_230,&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        std::__cxx11::string::~string
                  ((string *)
                   &expected_dataset1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_228);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        gtest_ar__3.message_.ptr_._5_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"employee_id",
                   (allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_298,"employee_name",
                   (allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 6));
        gtest_ar__3.message_.ptr_._5_1_ = 0;
        local_278 = &local_2b8;
        local_270 = 2;
        paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&gtest_ar__3.message_.ptr_ + 4);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(paVar1);
        __l_08._M_len = local_270;
        __l_08._M_array = local_278;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_268,__l_08,paVar1);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&gtest_ar__3.message_.ptr_ + 4));
        local_ed0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278;
        do {
          local_ed0 = local_ed0 + -1;
          std::__cxx11::string::~string((string *)local_ed0);
        } while (local_ed0 != &local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
        database::Query::dataset_abi_cxx11_(&local_2f8,(Query *)&gtest_ar_.message_);
        local_2d9 = std::operator==(&local_2f8,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_268);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2f8);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
        if (!bVar3) {
          testing::Message::Message(&local_300);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&filter1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (internal *)local_2d8,
                     (AssertionResult *)
                     "query_select_dataset_with_criteria1.dataset() == expected_dataset1","false",
                     "true",in_R9);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_308,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                     ,0x8a,pcVar6);
          testing::internal::AssertHelper::operator=(&local_308,&local_300);
          testing::internal::AssertHelper::~AssertHelper(&local_308);
          std::__cxx11::string::~string
                    ((string *)&filter1._M_t._M_impl.super__Rb_tree_header._M_node_count);
          testing::Message::~Message(&local_300);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          gtest_ar__4.message_.ptr_._2_1_ = 1;
          local_3a8 = &local_3a0;
          gtest_ar__4.message_.ptr_._4_4_ = 0;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
          ::pair<const_char_(&)[2],_database::ComparisonType,_true>
                    (&local_3f8,(char (*) [2])0x17b252,
                     (ComparisonType *)((long)&gtest_ar__4.message_.ptr_ + 4));
          local_3d0 = &local_3f8;
          local_3c8 = 1;
          paVar2 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                    *)((long)&gtest_ar__4.message_.ptr_ + 3);
          std::
          allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
          ::allocator(paVar2);
          __l_06._M_len = local_3c8;
          __l_06._M_array = local_3d0;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::vector(&local_3c0,__l_06,paVar2);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::pair<const_char_(&)[12],_true>(&local_3a0,(char (*) [12])"employee_id",&local_3c0);
          gtest_ar__4.message_.ptr_._2_1_ = 0;
          local_368 = &local_3a0;
          local_360 = 1;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
          ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                       *)&gtest_ar__4.message_);
          __l_07._M_len = local_360;
          __l_07._M_array = local_368;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                 *)local_358,__l_07,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&gtest_ar__4.message_.ptr_ + 1),(allocator_type *)&gtest_ar__4.message_);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
          ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                        *)&gtest_ar__4.message_);
          local_f28 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                       *)&local_368;
          do {
            local_f28 = local_f28 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
            ::~pair(local_f28);
          } while (local_f28 != &local_3a0);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector(&local_3c0);
          std::
          allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
          ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                        *)((long)&gtest_ar__4.message_.ptr_ + 3));
          local_f40 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                       *)&local_3d0;
          do {
            local_f40 = local_f40 + -1;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
            ::~pair(local_f40);
          } while (local_f40 != &local_3f8);
          database::Query::filter_abi_cxx11_(&local_450,(Query *)&gtest_ar_.message_);
          local_419 = std::operator==(&local_450,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                       *)local_358);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_418,&local_419,(type *)0x0);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~map(&local_450);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
          if (!bVar3) {
            testing::Message::Message(&local_458);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       &query_select_dataset_with_criteria2.m_filter._M_t._M_impl.
                        super__Rb_tree_header._M_node_count,(internal *)local_418,
                       (AssertionResult *)"query_select_dataset_with_criteria1.filter() == filter1",
                       "false","true",in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_460,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                       ,0x8e,pcVar6);
            testing::internal::AssertHelper::operator=(&local_460,&local_458);
            testing::internal::AssertHelper::~AssertHelper(&local_460);
            std::__cxx11::string::~string
                      ((string *)
                       &query_select_dataset_with_criteria2.m_filter._M_t._M_impl.
                        super__Rb_tree_header._M_node_count);
            testing::Message::~Message(&local_458);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            database::Query::Query
                      ((Query *)&gtest_ar__5.message_,
                       "select employee_name from company.employee where employee_status = fulltime and employee_department <> sales"
                      );
            TVar5 = database::Query::transactionType((Query *)&gtest_ar__5.message_);
            local_5a1 = TVar5 == select_dataset;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_5a0,&local_5a1,(type *)0x0);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
            if (!bVar3) {
              testing::Message::Message(&local_5b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_5a0,
                         (AssertionResult *)
                         "query_select_dataset_with_criteria2.transactionType() == database::select_dataset"
                         ,"false","true",in_R9);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_5b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                         ,0x91,pcVar6);
              testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
              testing::internal::AssertHelper::~AssertHelper(&local_5b8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_5b0);
            }
            gtest_ar__1.message_.ptr_._5_3_ = 0;
            gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
              TVar4 = database::Query::transactionMetaType((Query *)&gtest_ar__5.message_);
              local_5e9 = TVar4 == dml;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_5e8,&local_5e9,(type *)0x0);
              bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
              if (!bVar3) {
                testing::Message::Message(&local_5f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_5e8,
                           (AssertionResult *)
                           "query_select_dataset_with_criteria2.transactionMetaType() == database::dml"
                           ,"false","true",in_R9);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_600,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0x92,pcVar6);
                testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
                testing::internal::AssertHelper::~AssertHelper(&local_600);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_5f8);
              }
              gtest_ar__1.message_.ptr_._5_3_ = 0;
              gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                database::Query::databaseName_abi_cxx11_(&local_658,(Query *)&gtest_ar__5.message_);
                local_631 = std::operator==(&local_658,"company");
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_630,&local_631,(type *)0x0);
                std::__cxx11::string::~string((string *)&local_658);
                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_630);
                if (!bVar3) {
                  testing::Message::Message(&local_660);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_630,
                             (AssertionResult *)
                             "query_select_dataset_with_criteria2.databaseName() == \"company\"",
                             "false","true",in_R9);
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_668,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                             ,0x93,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_668,&local_660);
                  testing::internal::AssertHelper::~AssertHelper(&local_668);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_660);
                }
                gtest_ar__1.message_.ptr_._5_3_ = 0;
                gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                  database::Query::containerName_abi_cxx11_
                            (&local_6c0,(Query *)&gtest_ar__5.message_);
                  local_699 = std::operator==(&local_6c0,"employee");
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_698,&local_699,(type *)0x0);
                  std::__cxx11::string::~string((string *)&local_6c0);
                  bVar3 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_698);
                  if (!bVar3) {
                    testing::Message::Message(&local_6c8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)
                               &expected_dataset2.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (internal *)local_698,
                               (AssertionResult *)
                               "query_select_dataset_with_criteria2.containerName() == \"employee\""
                               ,"false","true",in_R9);
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_6d0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                               ,0x94,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
                    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
                    std::__cxx11::string::~string
                              ((string *)
                               &expected_dataset2.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    testing::Message::~Message(&local_6c8);
                  }
                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                  gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                    gtest_ar__9.message_.ptr_._6_1_ = 1;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_738,"employee_name",
                               (allocator<char> *)((long)&gtest_ar__9.message_.ptr_ + 7));
                    gtest_ar__9.message_.ptr_._6_1_ = 0;
                    local_718 = &local_738;
                    local_710 = 1;
                    paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)((long)&gtest_ar__9.message_.ptr_ + 5);
                    std::
                    allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::allocator(paVar1);
                    __l_05._M_len = local_710;
                    __l_05._M_array = local_718;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_708,__l_05,paVar1);
                    std::
                    allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)((long)&gtest_ar__9.message_.ptr_ + 5));
                    local_fe0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_718;
                    do {
                      local_fe0 = local_fe0 + -1;
                      std::__cxx11::string::~string((string *)local_fe0);
                    } while (local_fe0 != &local_738);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)((long)&gtest_ar__9.message_.ptr_ + 7));
                    database::Query::dataset_abi_cxx11_(&local_778,(Query *)&gtest_ar__5.message_);
                    local_759 = std::operator==(&local_778,
                                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_708);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_758,&local_759,(type *)0x0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_778);
                    bVar3 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_758);
                    if (!bVar3) {
                      testing::Message::Message(&local_780);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&filter2._M_t._M_impl.super__Rb_tree_header._M_node_count
                                 ,(internal *)local_758,
                                 (AssertionResult *)
                                 "query_select_dataset_with_criteria2.dataset() == expected_dataset2"
                                 ,"false","true",in_R9);
                      pcVar6 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_788,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                 ,0x96,pcVar6);
                      testing::internal::AssertHelper::operator=(&local_788,&local_780);
                      testing::internal::AssertHelper::~AssertHelper(&local_788);
                      std::__cxx11::string::~string
                                ((string *)&filter2._M_t._M_impl.super__Rb_tree_header._M_node_count
                                );
                      testing::Message::~Message(&local_780);
                    }
                    gtest_ar__1.message_.ptr_._5_3_ = 0;
                    gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
                    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                      gtest_ar__10.message_.ptr_._2_1_ = 1;
                      local_860 = &local_858;
                      local_8b8 = &local_8b0;
                      local_8bc = equal_to;
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                      ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                                (local_8b8,(char (*) [9])"fulltime",&local_8bc);
                      local_888 = &local_8b0;
                      local_880 = 1;
                      std::
                      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                      ::allocator(&local_8bd);
                      __l_03._M_len = local_880;
                      __l_03._M_array = local_888;
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::vector(&local_878,__l_03,&local_8bd);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      ::pair<const_char_(&)[16],_true>
                                (&local_858,(char (*) [16])"employee_status",&local_878);
                      gtest_ar__10.message_.ptr_._4_4_ = 1;
                      local_860 = &local_820;
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                      ::pair<const_char_(&)[6],_database::ComparisonType,_true>
                                (&local_910,(char (*) [6])0x17c056,
                                 (ComparisonType *)((long)&gtest_ar__10.message_.ptr_ + 4));
                      local_8e8 = &local_910;
                      local_8e0 = 1;
                      paVar2 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                                *)((long)&gtest_ar__10.message_.ptr_ + 3);
                      std::
                      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                      ::allocator(paVar2);
                      __l_02._M_len = local_8e0;
                      __l_02._M_array = local_8e8;
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::vector(&local_8d8,__l_02,paVar2);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      ::pair<const_char_(&)[20],_true>
                                (&local_820,(char (*) [20])"employee_department",&local_8d8);
                      gtest_ar__10.message_.ptr_._2_1_ = 0;
                      local_7e8 = &local_858;
                      local_7e0 = 2;
                      std::
                      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                   *)&gtest_ar__10.message_);
                      __l_04._M_len = local_7e0;
                      __l_04._M_array = local_7e8;
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                             *)local_7d8,__l_04,
                            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)&gtest_ar__10.message_.ptr_ + 1),
                            (allocator_type *)&gtest_ar__10.message_);
                      std::
                      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                    *)&gtest_ar__10.message_);
                      local_1048 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                                    *)&local_7e8;
                      do {
                        local_1048 = local_1048 + -1;
                        std::
                        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                        ::~pair(local_1048);
                      } while (local_1048 != &local_858);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::~vector(&local_8d8);
                      std::
                      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                      ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                                    *)((long)&gtest_ar__10.message_.ptr_ + 3));
                      local_1060 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                    *)&local_8e8;
                      do {
                        local_1060 = local_1060 + -1;
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                        ::~pair(local_1060);
                      } while (local_1060 != &local_910);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::~vector(&local_878);
                      std::
                      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                      ::~allocator(&local_8bd);
                      local_1078 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                    *)&local_888;
                      do {
                        local_1078 = local_1078 + -1;
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                        ::~pair(local_1078);
                      } while (local_1078 != &local_8b0);
                      database::Query::filter_abi_cxx11_(&local_968,(Query *)&gtest_ar__5.message_);
                      local_931 = std::operator==(&local_968,
                                                  (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                                  *)local_7d8);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_930,&local_931,(type *)0x0);
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::~map(&local_968);
                      bVar3 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_930);
                      if (!bVar3) {
                        testing::Message::Message(&local_970);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)
                                   &query_select_dataset_with_criteria3.m_filter._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count,(internal *)local_930,
                                   (AssertionResult *)
                                   "query_select_dataset_with_criteria2.filter() == filter2","false"
                                   ,"true",in_R9);
                        pcVar6 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_978,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                   ,0x9b,pcVar6);
                        testing::internal::AssertHelper::operator=(&local_978,&local_970);
                        testing::internal::AssertHelper::~AssertHelper(&local_978);
                        std::__cxx11::string::~string
                                  ((string *)
                                   &query_select_dataset_with_criteria3.m_filter._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count);
                        testing::Message::~Message(&local_970);
                      }
                      gtest_ar__1.message_.ptr_._5_3_ = 0;
                      gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
                      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                        database::Query::Query
                                  ((Query *)&gtest_ar__11.message_,
                                   "select employee_id,employee_name,employee_status from company.employee where employee_join_date >= 20170912 and employee_join_date <= 20180101"
                                  );
                        TVar5 = database::Query::transactionType((Query *)&gtest_ar__11.message_);
                        local_ab9 = TVar5 == select_dataset;
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_ab8,&local_ab9,(type *)0x0);
                        bVar3 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_ab8);
                        if (!bVar3) {
                          testing::Message::Message(&local_ac8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__12.message_,(internal *)local_ab8,
                                     (AssertionResult *)
                                     "query_select_dataset_with_criteria3.transactionType() == database::select_dataset"
                                     ,"false","true",in_R9);
                          pcVar6 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_ad0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                     ,0x9e,pcVar6);
                          testing::internal::AssertHelper::operator=(&local_ad0,&local_ac8);
                          testing::internal::AssertHelper::~AssertHelper(&local_ad0);
                          std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                          testing::Message::~Message(&local_ac8);
                        }
                        gtest_ar__1.message_.ptr_._5_3_ = 0;
                        gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
                        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                          TVar4 = database::Query::transactionMetaType
                                            ((Query *)&gtest_ar__11.message_);
                          local_b01 = TVar4 == dml;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_b00,&local_b01,(type *)0x0);
                          bVar3 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_b00);
                          if (!bVar3) {
                            testing::Message::Message(&local_b10);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__13.message_,(internal *)local_b00,
                                       (AssertionResult *)
                                       "query_select_dataset_with_criteria3.transactionMetaType() == database::dml"
                                       ,"false","true",in_R9);
                            pcVar6 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_b18,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                       ,0x9f,pcVar6);
                            testing::internal::AssertHelper::operator=(&local_b18,&local_b10);
                            testing::internal::AssertHelper::~AssertHelper(&local_b18);
                            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                            testing::Message::~Message(&local_b10);
                          }
                          gtest_ar__1.message_.ptr_._5_3_ = 0;
                          gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00);
                          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                            database::Query::databaseName_abi_cxx11_
                                      (&local_b70,(Query *)&gtest_ar__11.message_);
                            local_b49 = std::operator==(&local_b70,"company");
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_b48,&local_b49,(type *)0x0);
                            std::__cxx11::string::~string((string *)&local_b70);
                            bVar3 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_b48);
                            if (!bVar3) {
                              testing::Message::Message(&local_b78);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__14.message_,(internal *)local_b48,
                                         (AssertionResult *)
                                         "query_select_dataset_with_criteria3.databaseName() == \"company\""
                                         ,"false","true",in_R9);
                              pcVar6 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_b80,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                         ,0xa0,pcVar6);
                              testing::internal::AssertHelper::operator=(&local_b80,&local_b78);
                              testing::internal::AssertHelper::~AssertHelper(&local_b80);
                              std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                              testing::Message::~Message(&local_b78);
                            }
                            gtest_ar__1.message_.ptr_._5_3_ = 0;
                            gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48)
                            ;
                            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                              database::Query::containerName_abi_cxx11_
                                        (&local_bd8,(Query *)&gtest_ar__11.message_);
                              local_bb1 = std::operator==(&local_bd8,"employee");
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_bb0,&local_bb1,(type *)0x0);
                              std::__cxx11::string::~string((string *)&local_bd8);
                              bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_bb0);
                              if (!bVar3) {
                                testing::Message::Message(&local_be0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &expected_dataset3.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           (internal *)local_bb0,
                                           (AssertionResult *)
                                           "query_select_dataset_with_criteria3.containerName() == \"employee\""
                                           ,"false","true",in_R9);
                                pcVar6 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_be8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                           ,0xa1,pcVar6);
                                testing::internal::AssertHelper::operator=(&local_be8,&local_be0);
                                testing::internal::AssertHelper::~AssertHelper(&local_be8);
                                std::__cxx11::string::~string
                                          ((string *)
                                           &expected_dataset3.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                testing::Message::~Message(&local_be0);
                              }
                              gtest_ar__1.message_.ptr_._5_3_ = 0;
                              gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_bb0);
                              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                gtest_ar__15.message_.ptr_._4_1_ = 1;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_c90,"employee_id",
                                           (allocator<char> *)
                                           ((long)&gtest_ar__15.message_.ptr_ + 7));
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_c70,"employee_name",
                                           (allocator<char> *)
                                           ((long)&gtest_ar__15.message_.ptr_ + 6));
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_c50,"employee_status",
                                           (allocator<char> *)
                                           ((long)&gtest_ar__15.message_.ptr_ + 5));
                                gtest_ar__15.message_.ptr_._4_1_ = 0;
                                local_c30 = &local_c90;
                                local_c28 = 3;
                                paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)((long)&gtest_ar__15.message_.ptr_ + 3);
                                std::
                                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::allocator(paVar1);
                                __l_01._M_len = local_c28;
                                __l_01._M_array = local_c30;
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_c20,__l_01,paVar1);
                                std::
                                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)((long)&gtest_ar__15.message_.ptr_ + 3));
                                local_1160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_c30;
                                do {
                                  local_1160 = local_1160 + -1;
                                  std::__cxx11::string::~string((string *)local_1160);
                                } while (local_1160 != &local_c90);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)
                                           ((long)&gtest_ar__15.message_.ptr_ + 5));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)
                                           ((long)&gtest_ar__15.message_.ptr_ + 6));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)
                                           ((long)&gtest_ar__15.message_.ptr_ + 7));
                                database::Query::dataset_abi_cxx11_
                                          (&local_cd0,(Query *)&gtest_ar__11.message_);
                                local_cb1 = std::operator==(&local_cd0,
                                                            (
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_c20);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_cb0,&local_cb1,(type *)0x0);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector(&local_cd0);
                                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_cb0);
                                if (!bVar3) {
                                  testing::Message::Message(&local_cd8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &filter3._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count,(internal *)local_cb0,
                                             (AssertionResult *)
                                             "query_select_dataset_with_criteria3.dataset() == expected_dataset3"
                                             ,"false","true",in_R9);
                                  pcVar6 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_ce0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                             ,0xa3,pcVar6);
                                  testing::internal::AssertHelper::operator=(&local_ce0,&local_cd8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_ce0);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &filter3._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count);
                                  testing::Message::~Message(&local_cd8);
                                }
                                gtest_ar__1.message_.ptr_._5_3_ = 0;
                                gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_cb0);
                                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                  gtest_ar__16.message_.ptr_._6_1_ = 1;
                                  local_d80 = &local_d78;
                                  local_e00 = &local_df8;
                                  local_e08[1] = 2;
                                  std::
                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                  ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                                            (local_e00,(char (*) [9])"20170912",local_e08 + 1);
                                  local_e00 = &local_dd0;
                                  local_e08[0] = lesser_or_equal_to;
                                  std::
                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                  ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                                            (local_e00,(char (*) [9])0x17c290,local_e08);
                                  local_da8 = &local_df8;
                                  local_da0 = 2;
                                  paVar2 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                                            *)((long)&gtest_ar__16.message_.ptr_ + 7);
                                  std::
                                  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                                  ::allocator(paVar2);
                                  __l._M_len = local_da0;
                                  __l._M_array = local_da8;
                                  std::
                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                                  ::vector(&local_d98,__l,paVar2);
                                  std::
                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                                  ::pair<const_char_(&)[19],_true>
                                            (&local_d78,(char (*) [19])"employee_join_date",
                                             &local_d98);
                                  gtest_ar__16.message_.ptr_._6_1_ = 0;
                                  local_d40 = &local_d78;
                                  local_d38 = 1;
                                  this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                             *)((long)&gtest_ar__16.message_.ptr_ + 4);
                                  std::
                                  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                  ::allocator(this_00);
                                  __l_00._M_len = local_d38;
                                  __l_00._M_array = local_d40;
                                  std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                         *)local_d30,__l_00,
                                        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)((long)&gtest_ar__16.message_.ptr_ + 5),this_00);
                                  std::
                                  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                                *)((long)&gtest_ar__16.message_.ptr_ + 4));
                                  local_11b8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                                                *)&local_d40;
                                  do {
                                    local_11b8 = local_11b8 + -1;
                                    std::
                                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                                    ::~pair(local_11b8);
                                  } while (local_11b8 != &local_d78);
                                  std::
                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                                  ::~vector(&local_d98);
                                  std::
                                  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                                  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                                                *)((long)&gtest_ar__16.message_.ptr_ + 7));
                                  local_11d0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                                *)&local_da8;
                                  do {
                                    local_11d0 = local_11d0 + -1;
                                    std::
                                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                    ::~pair(local_11d0);
                                  } while (local_11d0 != &local_df8);
                                  database::Query::filter_abi_cxx11_
                                            (&local_e58,(Query *)&gtest_ar__11.message_);
                                  local_e21 = std::operator==(&local_e58,
                                                              (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                                  *)local_d30);
                                  testing::AssertionResult::AssertionResult<bool>
                                            ((AssertionResult *)local_e20,&local_e21,(type *)0x0);
                                  std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                  ::~map(&local_e58);
                                  bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_e20);
                                  if (!bVar3) {
                                    testing::Message::Message(&local_e60);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              (&local_e88,(internal *)local_e20,
                                               (AssertionResult *)
                                               "query_select_dataset_with_criteria3.filter() == filter3"
                                               ,"false","true",in_R9);
                                    pcVar6 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_e68,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                               ,0xa7,pcVar6);
                                    testing::internal::AssertHelper::operator=
                                              (&local_e68,&local_e60);
                                    testing::internal::AssertHelper::~AssertHelper(&local_e68);
                                    std::__cxx11::string::~string((string *)&local_e88);
                                    testing::Message::~Message(&local_e60);
                                  }
                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar3;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_e20);
                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                    gtest_ar__1.message_.ptr_._4_4_ = 0;
                                  }
                                  std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                          *)local_d30);
                                }
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_c20);
                              }
                            }
                          }
                        }
                        database::Query::~Query((Query *)&gtest_ar__11.message_);
                      }
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                              *)local_7d8);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_708);
                  }
                }
              }
            }
            database::Query::~Query((Query *)&gtest_ar__5.message_);
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                  *)local_358);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_268);
      }
    }
  }
  database::Query::~Query((Query *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(QueryTests_SelectDataSetWithCriteria,canDetermineSpecificationForSelectDataSetWithCriteria)
{
  database::Query query_select_dataset_with_criteria1 = "select employee_id,employee_name from company.employee where employee_id = 1";
  ASSERT_TRUE(query_select_dataset_with_criteria1.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria1.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria1.containerName() == "employee");
  std::vector<std::string> expected_dataset1 = {"employee_id","employee_name"};
  ASSERT_TRUE(query_select_dataset_with_criteria1.dataset() == expected_dataset1);
  database::api_filter_type filter1 = {
    {"employee_id",{{"1",database::equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria1.filter() == filter1);

  database::Query query_select_dataset_with_criteria2 = "select employee_name from company.employee where employee_status = fulltime and employee_department <> sales";
  ASSERT_TRUE(query_select_dataset_with_criteria2.transactionType() == database::select_dataset);
  ASSERT_TRUE(query_select_dataset_with_criteria2.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria2.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria2.containerName() == "employee");
  std::vector<std::string> expected_dataset2 = {"employee_name"};
  ASSERT_TRUE(query_select_dataset_with_criteria2.dataset() == expected_dataset2);
  database::api_filter_type filter2 = {
    {"employee_status",{{"fulltime",database::equal_to}}},
    {"employee_department",{{"sales",database::not_equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria2.filter() == filter2);

  database::Query query_select_dataset_with_criteria3 = "select employee_id,employee_name,employee_status from company.employee where employee_join_date >= 20170912 and employee_join_date <= 20180101";
  ASSERT_TRUE(query_select_dataset_with_criteria3.transactionType() == database::select_dataset);
  ASSERT_TRUE(query_select_dataset_with_criteria3.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria3.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria3.containerName() == "employee");
  std::vector<std::string> expected_dataset3 = {"employee_id","employee_name","employee_status"};
  ASSERT_TRUE(query_select_dataset_with_criteria3.dataset() == expected_dataset3);
  database::api_filter_type filter3 = {
    {"employee_join_date",{{"20170912",database::greater_or_equal_to},{"20180101",database::lesser_or_equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria3.filter() == filter3);
}